

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

optional<slang::TimeScale> slang::TimeScale::fromString(string_view str)

{
  TimeScaleValue base_00;
  string_view str_00;
  string_view str_01;
  bool bVar1;
  optional<slang::TimeScale> oVar2;
  TimeScaleValue *pTVar3;
  const_reference pvVar4;
  TimeScaleValue *pTVar5;
  undefined1 *puVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  optional<slang::TimeScaleValue> precision;
  optional<slang::TimeScaleValue> base;
  size_t idx;
  TimeScale *in_stack_ffffffffffffff38;
  TimeScaleMagnitude *__n;
  TimeScaleMagnitude *__pos;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar8;
  TimeScale local_6e;
  __unspec local_6a;
  type_conflict local_69;
  size_t *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  size_t *local_48;
  char *pcStack_40;
  TimeScaleValue *local_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  _Storage<slang::TimeScale,_true> local_5;
  bool local_1;
  
  str_00._M_str = in_stack_ffffffffffffffa8;
  str_00._M_len = in_stack_ffffffffffffffa0;
  parseValue(str_00,in_stack_ffffffffffffff98);
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::TimeScaleValue> *)0x3613d6);
  if (bVar1) {
    while( true ) {
      pTVar3 = (TimeScaleValue *)
               std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
      bVar1 = false;
      if (local_20 < pTVar3) {
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (&local_18,(size_type)local_20);
        bVar1 = *pvVar4 == ' ';
      }
      if (!bVar1) break;
      local_20 = (TimeScaleValue *)&local_20->magnitude;
    }
    pTVar3 = local_20;
    pTVar5 = (TimeScaleValue *)
             std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
    if ((pTVar3 < pTVar5) &&
       (pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (&local_18,(size_type)local_20), *pvVar4 == '/')) {
      do {
        local_20 = (TimeScaleValue *)&local_20->magnitude;
        __pos = (TimeScaleMagnitude *)local_20;
        puVar6 = (undefined1 *)
                 std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
        uVar8 = false;
        if (__pos < puVar6) {
          pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             (&local_18,(size_type)local_20);
          uVar8 = *pvVar4 == ' ';
        }
      } while ((bool)uVar8 != false);
      __n = (TimeScaleMagnitude *)local_20;
      puVar6 = (undefined1 *)std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
      if (__n < puVar6) {
        bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT17(uVar8,in_stack_ffffffffffffff60),(size_type)__pos,(size_type)__n
                          );
        local_48 = (size_t *)bVar7._M_len;
        pcStack_40 = bVar7._M_str;
        local_18._M_len = (size_t)local_48;
        local_18._M_str = pcStack_40;
        str_01._M_str = in_stack_ffffffffffffffa8;
        str_01._M_len = (size_t)pcStack_40;
        parseValue(str_01,local_48);
        bVar1 = std::optional::operator_cast_to_bool((optional<slang::TimeScaleValue> *)0x3615d2);
        if ((bVar1) &&
           (puVar6 = (undefined1 *)
                     std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18),
           local_20 == (TimeScaleValue *)puVar6)) {
          pTVar5 = std::optional<slang::TimeScaleValue>::operator*
                             ((optional<slang::TimeScaleValue> *)0x36161b);
          std::optional<slang::TimeScaleValue>::operator*
                    ((optional<slang::TimeScaleValue> *)0x36162d);
          local_69 = (type_conflict)
                     TimeScaleValue::operator<=>
                               (pTVar3,(TimeScaleValue *)CONCAT17(uVar8,in_stack_ffffffffffffff60));
          std::__cmp_cat::__unspec::__unspec(&local_6a,(__unspec *)0x0);
          bVar1 = std::operator>(local_69);
          if (bVar1) {
            std::optional<slang::TimeScale>::optional((optional<slang::TimeScale> *)0x361669);
          }
          else {
            pTVar3 = std::optional<slang::TimeScaleValue>::operator*
                               ((optional<slang::TimeScaleValue> *)0x361678);
            base_00 = *pTVar3;
            pTVar3 = std::optional<slang::TimeScaleValue>::operator*
                               ((optional<slang::TimeScaleValue> *)0x36168a);
            TimeScale(&local_6e,base_00,*pTVar3);
            std::optional<slang::TimeScale>::optional<slang::TimeScale,_true>
                      ((optional<slang::TimeScale> *)pTVar5,in_stack_ffffffffffffff38);
          }
        }
        else {
          std::optional<slang::TimeScale>::optional((optional<slang::TimeScale> *)0x36160c);
        }
      }
      else {
        std::optional<slang::TimeScale>::optional((optional<slang::TimeScale> *)0x361554);
      }
    }
    else {
      std::optional<slang::TimeScale>::optional((optional<slang::TimeScale> *)0x3614ae);
    }
  }
  else {
    std::optional<slang::TimeScale>::optional((optional<slang::TimeScale> *)0x3613e7);
  }
  oVar2.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = local_1;
  oVar2.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_payload = local_5;
  return (optional<slang::TimeScale>)
         oVar2.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
         super__Optional_payload_base<slang::TimeScale>;
}

Assistant:

std::optional<TimeScale> TimeScale::fromString(std::string_view str) {
    size_t idx;
    auto base = parseValue(str, idx);
    if (!base)
        return {};

    while (idx < str.size() && str[idx] == ' ')
        idx++;

    if (idx >= str.size() || str[idx] != '/')
        return {};

    do {
        idx++;
    } while (idx < str.size() && str[idx] == ' ');

    if (idx >= str.size())
        return {};

    str = str.substr(idx);
    auto precision = parseValue(str, idx);
    if (!precision || idx != str.length())
        return {};

    // Precision can't be a larger unit of time than the base.
    if (*precision > *base)
        return {};

    return TimeScale(*base, *precision);
}